

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O3

boolean find_offensive(monst *mtmp,musable *m)

{
  obj *poVar1;
  boolean bVar2;
  boolean bVar3;
  uint uVar4;
  monuse mVar5;
  obj *poVar6;
  short sVar7;
  int iVar8;
  monuse mVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  
  bVar2 = lined_up(mtmp);
  bVar10 = true;
  if ((youmonst.data == mons + 0x94 || youmonst.data == mons + 0x9d) ||
      u.uprops[0x2a].extrinsic != 0) {
    uVar4 = mt_random();
    bVar10 = (uVar4 & 1) == 0;
  }
  poVar6 = which_armor(mtmp,4);
  m->offensive = (obj *)0x0;
  m->has_offense = MUSE_NONE;
  if ((((mtmp->field_0x62 & 0x40) == 0) && ((mtmp->data->mflags1 & 0x52000) == 0)) &&
     ((u._1052_1_ & 1) == 0)) {
    bVar11 = false;
    bVar3 = in_your_sanctuary(mtmp,'\0','\0');
    if (bVar3 == '\0') {
      bVar3 = dmgtype(mtmp->data,0x1b);
      auVar12._0_4_ =
           -(uint)(((int)uwep == 0 && (int)uarms == 0) && ((int)uarm == 0 && (int)uarmc == 0));
      auVar12._4_4_ =
           -(uint)((uwep._4_4_ == 0 && uarms._4_4_ == 0) && (uarm._4_4_ == 0 && uarmc._4_4_ == 0));
      auVar12._8_4_ =
           -(uint)(((int)uquiver == 0 && (int)uarms == 0) && ((int)uarmc == 0 && (int)uarmg == 0));
      auVar12._12_4_ =
           -(uint)((uquiver._4_4_ == 0 && uarms._4_4_ == 0) &&
                  (uarmc._4_4_ == 0 && uarmg._4_4_ == 0));
      iVar8 = movmskps(0x31dab8,auVar12);
      bVar11 = false;
      if ((bVar3 == '\0' || iVar8 != 0xf) && (bVar2 != '\0')) {
        for (poVar1 = mtmp->minvent; poVar1 != (obj *)0x0; poVar1 = poVar1->nobj) {
          if (!bVar10) {
            mVar5 = m->has_offense;
            goto LAB_001fbd47;
          }
          sVar7 = poVar1->otyp;
          if (sVar7 == 0x1d4) {
            mVar9 = MUSE_WAN_DEATH;
            if ('\0' < poVar1->spe) goto LAB_001fbf45;
            mVar5 = m->has_offense;
            if (mVar5 != MUSE_WAN_SLEEP) {
LAB_001fbdb2:
              if (mVar5 == MUSE_WAN_FIRE) goto LAB_001fbf6a;
              if (sVar7 != 0x1d1) {
                if (mVar5 != MUSE_FIRE_HORN) {
                  if ((sVar7 == 0x100) && (mVar9 = MUSE_FIRE_HORN, '\0' < poVar1->spe))
                  goto LAB_001fbf45;
                  if (mVar5 != MUSE_WAN_COLD) goto LAB_001fbec1;
                }
                goto LAB_001fbf6a;
              }
              mVar9 = MUSE_WAN_FIRE;
              if ('\0' < poVar1->spe) goto LAB_001fbf45;
              if ((mVar5 == MUSE_WAN_COLD) || (mVar5 == MUSE_FIRE_HORN)) goto LAB_001fbf6a;
LAB_001fbec1:
              if (sVar7 != 0x1d2) {
                if (mVar5 != MUSE_FROST_HORN) {
                  if ((sVar7 == 0xff) && (mVar9 = MUSE_FROST_HORN, '\0' < poVar1->spe))
                  goto LAB_001fbf45;
                  if (mVar5 != MUSE_WAN_LIGHTNING) goto LAB_001fbf09;
                }
                goto LAB_001fbf6a;
              }
              mVar9 = MUSE_WAN_COLD;
              if ('\0' < poVar1->spe) goto LAB_001fbf45;
              if ((mVar5 == MUSE_WAN_LIGHTNING) || (mVar5 == MUSE_FROST_HORN)) goto LAB_001fbf6a;
LAB_001fbf09:
              if (sVar7 == 0x1d5) {
                mVar9 = MUSE_WAN_LIGHTNING;
                if ('\0' < poVar1->spe) goto LAB_001fbf45;
                if (mVar5 != MUSE_WAN_MAGIC_MISSILE) goto LAB_001fbd47;
                goto LAB_001fbf6a;
              }
              if (mVar5 == MUSE_WAN_MAGIC_MISSILE) goto LAB_001fbf6a;
              if ((sVar7 == 0x1d0) && (mVar9 = MUSE_WAN_MAGIC_MISSILE, '\0' < poVar1->spe))
              goto LAB_001fbf45;
LAB_001fbd47:
              if (mVar5 == MUSE_WAN_STRIKING) goto LAB_001fbf6a;
              sVar7 = poVar1->otyp;
              if (sVar7 == 0x1c4) {
                mVar9 = MUSE_WAN_STRIKING;
                if ('\0' < poVar1->spe) goto LAB_001fbf45;
                sVar7 = 0x1c4;
                if (mVar5 != MUSE_WAN_CANCELLATION) goto LAB_001fbe1b;
                goto LAB_001fbf6a;
              }
              if (mVar5 == MUSE_WAN_CANCELLATION) goto LAB_001fbf6a;
              if (sVar7 == 0x1ca) {
                mVar9 = MUSE_WAN_CANCELLATION;
                if ('\0' < poVar1->spe) goto LAB_001fbf45;
                sVar7 = 0x1ca;
              }
LAB_001fbe1b:
              if (mVar5 == MUSE_POT_PARALYSIS) goto LAB_001fbf6a;
              if ((sVar7 == 0x12e) && (mVar9 = MUSE_POT_PARALYSIS, -1 < multi)) goto LAB_001fbf45;
              if (mVar5 == MUSE_POT_BLINDNESS) goto LAB_001fbf6a;
              if (sVar7 == 0x133) {
                bVar2 = attacktype(mtmp->data,0xf);
                if (bVar2 == '\0') {
                  mVar9 = MUSE_POT_BLINDNESS;
                  goto LAB_001fbf45;
                }
                mVar5 = m->has_offense;
              }
              if (mVar5 == MUSE_POT_CONFUSION) goto LAB_001fbf6a;
              goto LAB_001fbf4b;
            }
          }
          else {
            mVar5 = m->has_offense;
            if (mVar5 == MUSE_WAN_SLEEP) goto LAB_001fbf6a;
            if (((sVar7 != 0x1d3) || (poVar1->spe < '\x01')) || (mVar9 = MUSE_WAN_SLEEP, multi < 0))
            goto LAB_001fbdb2;
LAB_001fbf45:
            mVar5 = mVar9;
            m->offensive = poVar1;
            m->has_offense = mVar5;
LAB_001fbf4b:
            sVar7 = poVar1->otyp;
            mVar9 = MUSE_POT_CONFUSION;
            if (sVar7 == 0x12d) {
LAB_001fbf5d:
              m->offensive = poVar1;
              m->has_offense = mVar9;
            }
            else if (mVar5 != MUSE_POT_SLEEPING) {
              mVar9 = MUSE_POT_SLEEPING;
              if (sVar7 == 0x13d) goto LAB_001fbf5d;
              if (mVar5 != MUSE_POT_ACID) {
                mVar9 = MUSE_POT_ACID;
                if (sVar7 == 0x141) goto LAB_001fbf5d;
                if ((sVar7 == 0x163) && (mVar5 != MUSE_SCR_EARTH)) {
                  if (((poVar6 == (obj *)0x0) ||
                      (6 < (ushort)((*(ushort *)&objects[poVar6->otyp].field_0x11 >> 4 & 0x1f) - 0xb
                                   ))) && ((mtmp->field_0x62 & 0x20) == 0)) {
                    uVar4 = mtmp->data->mflags1;
                    if (((((uVar4 & 0xc) == 0) && ((uVar4 >> 0x14 & 1) == 0)) &&
                        (mtmp->data->mlet != '6')) &&
                       (uVar4 = mt_random(),
                       0x19999999 <
                       (uVar4 * -0x33333333 >> 1 | (uint)((uVar4 * -0x33333333 & 1) != 0) << 0x1f)))
                    goto LAB_001fbf6a;
                  }
                  iVar8 = dist2((int)mtmp->mx,(int)mtmp->my,(int)mtmp->mux,(int)mtmp->muy);
                  if ((((iVar8 < 3) && ((mtmp->field_0x62 & 2) != 0)) &&
                      (((mtmp->data->mflags1 & 0x1000) == 0 &&
                       (bVar2 = on_level(&u.uz,&dungeon_topology.d_rogue_level), bVar2 == '\0'))))
                     && ((mVar9 = MUSE_SCR_EARTH, u.uz.dnum != dungeon_topology.d_astral_level.dnum
                         || (bVar2 = on_level(&u.uz,&dungeon_topology.d_earth_level), bVar2 != '\0')
                         ))) goto LAB_001fbf5d;
                }
              }
            }
          }
LAB_001fbf6a:
        }
        bVar11 = m->has_offense != MUSE_NONE;
      }
    }
  }
  else {
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

boolean find_offensive(struct monst *mtmp, struct musable *m)
{
	struct obj *obj;
	boolean ranged_stuff = lined_up(mtmp);
	boolean reflection_skip = (Reflecting && rn2(2));
	struct obj *helmet = which_armor(mtmp, W_ARMH);

	m->offensive = NULL;
	m->has_offense = 0;
	if (mtmp->mpeaceful || is_animal(mtmp->data) ||
				mindless(mtmp->data) || nohands(mtmp->data))
		return FALSE;
	if (u.uswallow) return FALSE;
	if (in_your_sanctuary(mtmp, 0, 0)) return FALSE;
	if (dmgtype(mtmp->data, AD_HEAL) && !uwep && !uarmu
	    && !uarm && !uarmh && !uarms && !uarmg && !uarmc && !uarmf)
		return FALSE;

	if (!ranged_stuff) return FALSE;
#define nomore(x) if (m->has_offense==x) continue;
	for (obj=mtmp->minvent; obj; obj=obj->nobj) {
		/* nomore(MUSE_WAN_DEATH); */
		if (!reflection_skip) {
		    if (obj->otyp == WAN_DEATH && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_DEATH;
		    }
		    nomore(MUSE_WAN_SLEEP);
		    if (obj->otyp == WAN_SLEEP && obj->spe > 0 && multi >= 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_SLEEP;
		    }
		    nomore(MUSE_WAN_FIRE);
		    if (obj->otyp == WAN_FIRE && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_FIRE;
		    }
		    nomore(MUSE_FIRE_HORN);
		    if (obj->otyp == FIRE_HORN && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_FIRE_HORN;
		    }
		    nomore(MUSE_WAN_COLD);
		    if (obj->otyp == WAN_COLD && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_COLD;
		    }
		    nomore(MUSE_FROST_HORN);
		    if (obj->otyp == FROST_HORN && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_FROST_HORN;
		    }
		    nomore(MUSE_WAN_LIGHTNING);
		    if (obj->otyp == WAN_LIGHTNING && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_LIGHTNING;
		    }
		    nomore(MUSE_WAN_MAGIC_MISSILE);
		    if (obj->otyp == WAN_MAGIC_MISSILE && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_MAGIC_MISSILE;
		    }
		}
		nomore(MUSE_WAN_STRIKING);
		if (obj->otyp == WAN_STRIKING && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_STRIKING;
		}
		nomore(MUSE_WAN_CANCELLATION);
		if (obj->otyp == WAN_CANCELLATION && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_CANCELLATION;
		}
		nomore(MUSE_POT_PARALYSIS);
		if (obj->otyp == POT_PARALYSIS && multi >= 0) {
			m->offensive = obj;
			m->has_offense = MUSE_POT_PARALYSIS;
		}
		nomore(MUSE_POT_BLINDNESS);
		if (obj->otyp == POT_BLINDNESS && !attacktype(mtmp->data, AT_GAZE)) {
			m->offensive = obj;
			m->has_offense = MUSE_POT_BLINDNESS;
		}
		nomore(MUSE_POT_CONFUSION);
		if (obj->otyp == POT_CONFUSION) {
			m->offensive = obj;
			m->has_offense = MUSE_POT_CONFUSION;
		}
		nomore(MUSE_POT_SLEEPING);
		if (obj->otyp == POT_SLEEPING) {
			m->offensive = obj;
			m->has_offense = MUSE_POT_SLEEPING;
		}
		nomore(MUSE_POT_ACID);
		if (obj->otyp == POT_ACID) {
			m->offensive = obj;
			m->has_offense = MUSE_POT_ACID;
		}
		/* we can safely put this scroll here since the locations that
		 * are in a 1 square radius are a subset of the locations that
		 * are in wand range
		 */
		nomore(MUSE_SCR_EARTH);
		if (obj->otyp == SCR_EARTH
		       && ((helmet && is_metallic(helmet)) ||
				mtmp->mconf || amorphous(mtmp->data) ||
				passes_walls(mtmp->data) ||
				noncorporeal(mtmp->data) ||
				unsolid(mtmp->data) || !rn2(10))
		       && dist2(mtmp->mx,mtmp->my,mtmp->mux,mtmp->muy) <= 2
		       && mtmp->mcansee && haseyes(mtmp->data)
		       && !Is_rogue_level(&u.uz)
		       && (!In_endgame(&u.uz) || Is_earthlevel(&u.uz))) {
		    m->offensive = obj;
		    m->has_offense = MUSE_SCR_EARTH;
		}
	}
	return (boolean)(!!m->has_offense);
#undef nomore
}